

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

void __thiscall
RTree<int,_double,_2,_double,_8,_4>::LoadNodes
          (RTree<int,_double,_2,_double,_8,_4> *this,Node *a_nodeA,Node *a_nodeB,
          PartitionVars *a_parVars)

{
  bool bVar1;
  long lVar2;
  Branch *a_branch;
  Node *targetNodes [2];
  Node *local_48 [3];
  
  if (a_nodeA == (Node *)0x0) {
    __assert_fail("a_nodeA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                  ,0x55d,
                  "void RTree<int, double, 2>::LoadNodes(Node *, Node *, PartitionVars *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                 );
  }
  if (a_nodeB != (Node *)0x0) {
    if (a_parVars == (PartitionVars *)0x0) {
      __assert_fail("a_parVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                    ,0x55f,
                    "void RTree<int, double, 2>::LoadNodes(Node *, Node *, PartitionVars *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                   );
    }
    a_branch = a_parVars->m_branchBuf;
    lVar2 = 0;
    while( true ) {
      if (a_parVars->m_total <= lVar2) {
        return;
      }
      if (1 < (ulong)(uint)a_parVars->m_partition[lVar2]) break;
      local_48[0] = a_nodeA;
      local_48[1] = a_nodeB;
      bVar1 = AddBranch(this,a_branch,local_48[(uint)a_parVars->m_partition[lVar2]],(Node **)0x0);
      if (bVar1) {
        __assert_fail("!nodeWasSplit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                      ,0x56a,
                      "void RTree<int, double, 2>::LoadNodes(Node *, Node *, PartitionVars *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                     );
      }
      lVar2 = lVar2 + 1;
      a_branch = a_branch + 1;
    }
    __assert_fail("a_parVars->m_partition[index] == 0 || a_parVars->m_partition[index] == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                  ,0x563,
                  "void RTree<int, double, 2>::LoadNodes(Node *, Node *, PartitionVars *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                 );
  }
  __assert_fail("a_nodeB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                ,0x55e,
                "void RTree<int, double, 2>::LoadNodes(Node *, Node *, PartitionVars *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
               );
}

Assistant:

RTREE_TEMPLATE
void RTREE_QUAL::LoadNodes(Node* a_nodeA, Node* a_nodeB, PartitionVars* a_parVars)
{
  ASSERT(a_nodeA);
  ASSERT(a_nodeB);
  ASSERT(a_parVars);

  for(int index=0; index < a_parVars->m_total; ++index)
  {
    ASSERT(a_parVars->m_partition[index] == 0 || a_parVars->m_partition[index] == 1);

    int targetNodeIndex = a_parVars->m_partition[index];
    Node* targetNodes[] = {a_nodeA, a_nodeB};

    // It is assured that AddBranch here will not cause a node split. 
    bool nodeWasSplit = AddBranch(&a_parVars->m_branchBuf[index], targetNodes[targetNodeIndex], NULL);
    ASSERT(!nodeWasSplit);
  }
}